

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O0

void __thiscall
SteamIRCCommand::trigger
          (SteamIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  bool bVar1;
  byte bVar2;
  long lVar3;
  ulong uVar4;
  pointer pPVar5;
  size_t sVar6;
  size_type sVar7;
  char *pcVar8;
  char *pcVar9;
  size_t sVar10;
  __sv_type _Var11;
  basic_string_view<char,_std::char_traits<char>_> bVar12;
  size_t local_208;
  char *local_200;
  string local_1e8;
  __sv_type local_1c8;
  size_t local_1b8;
  char *pcStack_1b0;
  _Self local_1a0;
  _Self local_198;
  iterator node_1;
  Server *server_1;
  uint local_180;
  uint i_1;
  uint realPlayers;
  uint total;
  char *local_170;
  char *local_158;
  char *local_150;
  string local_138;
  undefined1 local_118 [32];
  string local_f8;
  undefined1 local_d8 [8];
  string playerName;
  iterator local_a8;
  undefined1 local_a0 [8];
  iterator node;
  Server *server;
  undefined4 local_7c;
  undefined1 local_78 [4];
  uint i;
  string msg;
  int type;
  Channel *chan;
  IRC_Bot *source_local;
  SteamIRCCommand *this_local;
  string_view nick_local;
  string_view channel_local;
  
  pcVar9 = channel._M_str;
  sVar10 = channel._M_len;
  lVar3 = Jupiter::IRC::Client::getChannel(source,sVar10,pcVar9);
  if (lVar3 != 0) {
    msg.field_2._12_4_ = Jupiter::IRC::Client::Channel::getType();
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&parameters);
    if (bVar1) {
      server_1._4_4_ = 0;
      while( true ) {
        RenX::getCore();
        uVar4 = RenX::Core::getServerCount();
        if (server_1._4_4_ == uVar4) break;
        uVar4 = RenX::getCore();
        node_1._M_node = (_List_node_base *)RenX::Core::getServer(uVar4);
        uVar4 = RenX::Server::isLogChanType((int)node_1._M_node);
        if ((uVar4 & 1) != 0) {
          i_1 = 0;
          local_180 = 0;
          local_198._M_node =
               (_List_node_base *)
               std::__cxx11::list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>::begin
                         (node_1._M_node + 1);
          while( true ) {
            local_1a0._M_node =
                 (_List_node_base *)
                 std::__cxx11::list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>::end
                           (node_1._M_node + 1);
            bVar1 = std::operator==(&local_198,&local_1a0);
            if (((bVar1 ^ 0xffU) & 1) == 0) break;
            pPVar5 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_198);
            if ((pPVar5->isBot & 1U) == 0) {
              local_180 = local_180 + 1;
              pPVar5 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_198);
              if (pPVar5->steamid != 0) {
                i_1 = i_1 + 1;
              }
            }
            std::_List_iterator<RenX::PlayerInfo>::operator++(&local_198);
          }
          if (local_180 == 0) {
            bVar12 = sv("No players are in-game.",0x17);
            local_208 = bVar12._M_len;
            local_200 = bVar12._M_str;
            Jupiter::IRC::Client::sendMessage(source,sVar10,pcVar9,local_208,local_200);
          }
          else {
            local_1b8 = sVar10;
            pcStack_1b0 = pcVar9;
            string_printf_abi_cxx11_
                      (&local_1e8,"%.2f%% (%u/%u) of players are using Steam.",
                       SUB84(((double)i_1 * 100.0) / (double)local_180,0),(ulong)i_1,
                       (ulong)local_180);
            local_1c8 = std::__cxx11::string::operator_cast_to_basic_string_view
                                  ((string *)&local_1e8);
            Jupiter::IRC::Client::sendMessage
                      (source,local_1b8,pcStack_1b0,local_1c8._M_len,local_1c8._M_str);
            std::__cxx11::string::~string((string *)&local_1e8);
          }
        }
        server_1._4_4_ = server_1._4_4_ + 1;
      }
    }
    else {
      std::__cxx11::string::string((string *)local_78);
      local_7c = 0;
      while( true ) {
        RenX::getCore();
        local_158 = (char *)RenX::Core::getServerCount();
        if ((char *)(ulong)(uint)local_7c == local_158) break;
        uVar4 = RenX::getCore();
        node._M_node = (_List_node_base *)RenX::Core::getServer(uVar4);
        bVar2 = RenX::Server::isLogChanType((int)node._M_node);
        if ((bVar2 & 1) != 0) {
          local_a0 = (undefined1  [8])
                     std::__cxx11::list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>::begin
                               ((list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_> *)
                                (node._M_node + 1));
          while( true ) {
            local_a8 = std::__cxx11::list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>::end
                                 (node._M_node + 1);
            bVar1 = std::operator==((_Self *)local_a0,&stack0xffffffffffffff58);
            if (((bVar1 ^ 0xffU) & 1) == 0) break;
            pPVar5 = std::_List_iterator<RenX::PlayerInfo>::operator->
                               ((_List_iterator<RenX::PlayerInfo> *)local_a0);
            playerName.field_2._8_8_ = parameters._M_len;
            bVar12._M_str = local_158;
            bVar12._M_len = (size_t)parameters._M_str;
            sVar6 = jessilib::findi<char,char>
                              ((jessilib *)&pPVar5->name,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               parameters._M_len,bVar12);
            if (sVar6 != 0xffffffffffffffff) {
              std::_List_iterator<RenX::PlayerInfo>::operator*
                        ((_List_iterator<RenX::PlayerInfo> *)local_a0);
              RenX::getFormattedPlayerName_abi_cxx11_((PlayerInfo *)local_d8);
              sVar7 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_d8);
              pcVar8 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                                 ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_d8);
              pPVar5 = std::_List_iterator<RenX::PlayerInfo>::operator->
                                 ((_List_iterator<RenX::PlayerInfo> *)local_a0);
              string_printf_abi_cxx11_
                        ((string *)(local_118 + 0x20),"\x0303[Steam] \x03%.*s (ID: %d) ",sVar7,
                         pcVar8,(ulong)(uint)pPVar5->id);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(local_118 + 0x20));
              std::__cxx11::string::~string((string *)(local_118 + 0x20));
              pPVar5 = std::_List_iterator<RenX::PlayerInfo>::operator->
                                 ((_List_iterator<RenX::PlayerInfo> *)local_a0);
              if (pPVar5->steamid == 0) {
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_78,"is not using steam.");
              }
              else {
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_78,"is using steam ID \x02");
                std::_List_iterator<RenX::PlayerInfo>::operator*
                          ((_List_iterator<RenX::PlayerInfo> *)local_a0);
                RenX::Server::formatSteamID_abi_cxx11_((PlayerInfo *)local_118);
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_118);
                std::__cxx11::string::~string((string *)local_118);
                pPVar5 = std::_List_iterator<RenX::PlayerInfo>::operator->
                                   ((_List_iterator<RenX::PlayerInfo> *)local_a0);
                string_printf_abi_cxx11_
                          (&local_138,
                           "\x02; Steam Profile: \x02https://steamcommunity.com/profiles/%llu\x02",
                           pPVar5->steamid);
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_78,&local_138);
                std::__cxx11::string::~string((string *)&local_138);
              }
              _Var11 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_78);
              local_158 = (char *)_Var11._M_len;
              local_150 = _Var11._M_str;
              Jupiter::IRC::Client::sendMessage(source,sVar10,pcVar9,local_158,local_150);
              std::__cxx11::string::~string((string *)local_d8);
            }
            std::_List_iterator<RenX::PlayerInfo>::operator++
                      ((_List_iterator<RenX::PlayerInfo> *)local_a0);
          }
        }
        local_7c = local_7c + 1;
      }
      bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_78);
      if (bVar1) {
        bVar12 = sv("Error: Player not found.",0x18);
        _realPlayers = bVar12._M_len;
        local_170 = bVar12._M_str;
        Jupiter::IRC::Client::sendNotice(source,nick._M_len,nick._M_str,_realPlayers,local_170);
      }
      std::__cxx11::string::~string((string *)local_78);
    }
  }
  return;
}

Assistant:

void SteamIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters) {
	Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
	if (chan != nullptr) {
		int type = chan->getType();
		if (!parameters.empty()) {
			std::string msg;
			for (unsigned int i = 0; i != RenX::getCore()->getServerCount(); i++) {
				RenX::Server *server = RenX::getCore()->getServer(i);
				if (server->isLogChanType(type)) {
					for (auto node = server->players.begin(); node != server->players.end(); ++node) {
						if (jessilib::findi(node->name, parameters) != std::string::npos) {
							std::string playerName = RenX::getFormattedPlayerName(*node);
							msg = string_printf(IRCCOLOR "03[Steam] " IRCCOLOR "%.*s (ID: %d) ", playerName.size(),
								playerName.data(), node->id);
							if (node->steamid != 0) {
								msg += "is using steam ID " IRCBOLD;
								msg += server->formatSteamID(*node);
								msg += string_printf(IRCBOLD "; Steam Profile: " IRCBOLD "https://steamcommunity.com/profiles/%llu" IRCBOLD, node->steamid);
							}
							else
								msg += "is not using steam.";

							source->sendMessage(channel, msg);
						}
					}
				}
			}
			if (msg.empty())
				source->sendNotice(nick, "Error: Player not found."sv);
		}
		else
		{
			unsigned int total;
			unsigned int realPlayers;
			for (unsigned int i = 0; i != RenX::getCore()->getServerCount(); i++)
			{
				RenX::Server *server = RenX::getCore()->getServer(i);
				if (server->isLogChanType(type))
				{
					total = 0;
					realPlayers = 0;
					for (auto node = server->players.begin(); node != server->players.end(); ++node)
					{
						if (node->isBot == false)
						{
							realPlayers++;
							if (node->steamid != 0)
								total++;
						}
					}

					if (realPlayers != 0)
						source->sendMessage(channel, string_printf("%.2f%% (%u/%u) of players are using Steam.", ((double)total * 100) / ((double)realPlayers), total, realPlayers));
					else
						source->sendMessage(channel, "No players are in-game."sv);
				}
			}
		}
	}
}